

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_copy_logical_type
          (CompilerGLSL *this,uint32_t lhs_id,uint32_t lhs_type_id,uint32_t rhs_id,
          uint32_t rhs_type_id,SmallVector<unsigned_int,_8UL> *chain)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint *puVar7;
  size_t sVar8;
  TypedID *pTVar9;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar10;
  bool local_169;
  SPIRExpression *local_168;
  SPIRExpression *rhs_expr;
  undefined1 local_158;
  _Node_iterator_base<unsigned_int,_false> local_150;
  undefined1 local_148;
  bool local_139;
  SPIRExpression *local_138;
  SPIRExpression *lhs_expr;
  undefined1 local_128 [4];
  uint32_t id;
  string rhs;
  undefined1 local_108 [8];
  string lhs;
  undefined1 local_e8 [8];
  AccessChainMeta rhs_meta;
  AccessChainMeta lhs_meta;
  uint local_98;
  uint32_t i_1;
  uint32_t member_count;
  SmallVector<unsigned_int,_8UL> local_80;
  uint local_44;
  uint local_40;
  uint32_t i;
  SPIRType *pSStack_38;
  uint32_t array_size;
  SPIRType *rhs_type;
  SPIRType *lhs_type;
  SmallVector<unsigned_int,_8UL> *chain_local;
  uint32_t rhs_type_id_local;
  uint32_t rhs_id_local;
  uint32_t lhs_type_id_local;
  uint32_t lhs_id_local;
  CompilerGLSL *this_local;
  
  lhs_type = (SPIRType *)chain;
  chain_local._0_4_ = rhs_type_id;
  chain_local._4_4_ = rhs_id;
  rhs_type_id_local = lhs_type_id;
  rhs_id_local = lhs_id;
  _lhs_type_id_local = this;
  rhs_type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,lhs_type_id);
  pSStack_38 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(uint32_t)chain_local);
  bVar4 = VectorView<unsigned_int>::empty(&(rhs_type->array).super_VectorView<unsigned_int>);
  if (bVar4) {
    if (*(int *)&(rhs_type->super_IVariant).field_0xc == 0xf) {
      i_1 = 0;
      SmallVector<unsigned_int,_8UL>::push_back(chain,&i_1);
      sVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(rhs_type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      for (local_98 = 0; local_98 < (uint)sVar8; local_98 = local_98 + 1) {
        puVar7 = VectorView<unsigned_int>::back(&chain->super_VectorView<unsigned_int>);
        uVar3 = rhs_id_local;
        *puVar7 = local_98;
        pTVar9 = (TypedID *)
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           (&(rhs_type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                            (ulong)local_98);
        uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar9);
        uVar2 = chain_local._4_4_;
        pTVar9 = (TypedID *)
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           (&(pSStack_38->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                            (ulong)local_98);
        uVar6 = TypedID::operator_cast_to_unsigned_int(pTVar9);
        SmallVector<unsigned_int,_8UL>::SmallVector
                  ((SmallVector<unsigned_int,_8UL> *)&lhs_meta.need_transpose,chain);
        emit_copy_logical_type
                  (this,uVar3,uVar5,uVar2,uVar6,
                   (SmallVector<unsigned_int,_8UL> *)&lhs_meta.need_transpose);
        SmallVector<unsigned_int,_8UL>::~SmallVector
                  ((SmallVector<unsigned_int,_8UL> *)&lhs_meta.need_transpose);
      }
    }
    else {
      AccessChainMeta::AccessChainMeta((AccessChainMeta *)&rhs_meta.need_transpose);
      AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_e8);
      uVar2 = rhs_id_local;
      puVar7 = VectorView<unsigned_int>::data(&chain->super_VectorView<unsigned_int>);
      sVar8 = VectorView<unsigned_int>::size(&chain->super_VectorView<unsigned_int>);
      access_chain_internal_abi_cxx11_
                ((CompilerGLSL *)local_108,(uint32_t)this,(uint32_t *)(ulong)uVar2,(uint32_t)puVar7,
                 (AccessChainFlags)sVar8,(AccessChainMeta *)0x1);
      uVar1 = chain_local._4_4_;
      puVar7 = VectorView<unsigned_int>::data(&chain->super_VectorView<unsigned_int>);
      sVar8 = VectorView<unsigned_int>::size(&chain->super_VectorView<unsigned_int>);
      access_chain_internal_abi_cxx11_
                ((CompilerGLSL *)local_128,(uint32_t)this,(uint32_t *)(ulong)uVar1,(uint32_t)puVar7,
                 (AccessChainFlags)sVar8,(AccessChainMeta *)0x1);
      lhs_expr._4_4_ = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
      chain_local._4_4_ = lhs_expr._4_4_ + 1;
      local_139 = true;
      rhs_id_local = lhs_expr._4_4_;
      local_138 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                            (&this->super_Compiler,lhs_expr._4_4_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,&rhs_type_id_local,&local_139);
      local_138->need_transpose = (bool)(rhs_meta.relaxed_precision & 1);
      if ((rhs_meta.access_meshlet_position_y & 1U) != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,rhs_id_local,SPIRVCrossDecorationPhysicalTypePacked,0);
      }
      if (rhs_meta._4_4_ != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,rhs_id_local,SPIRVCrossDecorationPhysicalTypeID,
                   rhs_meta._4_4_);
      }
      pVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&(this->super_Compiler).forwarded_temporaries,&rhs_id_local);
      local_150._M_cur =
           (__node_type *)pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_148 = pVar10.second;
      pVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert(&(this->super_Compiler).suppressed_usage_tracking,&rhs_id_local);
      rhs_expr = (SPIRExpression *)
                 pVar10.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_158 = pVar10.second;
      local_169 = true;
      local_168 = Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                            (&this->super_Compiler,chain_local._4_4_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128,(uint *)&chain_local,&local_169);
      local_168->need_transpose = (bool)(local_e8[4] & 1);
      if ((local_e8[5] & 1U) != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,chain_local._4_4_,SPIRVCrossDecorationPhysicalTypePacked,0)
        ;
      }
      if (local_e8._0_4_ != 0) {
        Compiler::set_extended_decoration
                  (&this->super_Compiler,chain_local._4_4_,SPIRVCrossDecorationPhysicalTypeID,
                   local_e8._0_4_);
      }
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&(this->super_Compiler).forwarded_temporaries,(value_type *)((long)&chain_local + 4))
      ;
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&(this->super_Compiler).suppressed_usage_tracking,
               (value_type *)((long)&chain_local + 4));
      (*(this->super_Compiler)._vptr_Compiler[0x3f])
                (this,(ulong)rhs_id_local,(ulong)chain_local._4_4_);
      ::std::__cxx11::string::~string((string *)local_128);
      ::std::__cxx11::string::~string((string *)local_108);
    }
  }
  else {
    i = to_array_size_literal(this,rhs_type);
    local_40 = 0;
    SmallVector<unsigned_int,_8UL>::push_back(chain,&local_40);
    for (local_44 = 0; uVar1 = local_44, local_44 < i; local_44 = local_44 + 1) {
      puVar7 = VectorView<unsigned_int>::back(&chain->super_VectorView<unsigned_int>);
      uVar3 = rhs_id_local;
      *puVar7 = uVar1;
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&rhs_type->parent_type);
      uVar2 = chain_local._4_4_;
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_38->parent_type);
      SmallVector<unsigned_int,_8UL>::SmallVector(&local_80,chain);
      emit_copy_logical_type(this,uVar3,uVar5,uVar2,uVar6,&local_80);
      SmallVector<unsigned_int,_8UL>::~SmallVector(&local_80);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_copy_logical_type(uint32_t lhs_id, uint32_t lhs_type_id, uint32_t rhs_id, uint32_t rhs_type_id,
                                          SmallVector<uint32_t> chain)
{
	// Fully unroll all member/array indices one by one.

	auto &lhs_type = get<SPIRType>(lhs_type_id);
	auto &rhs_type = get<SPIRType>(rhs_type_id);

	if (!lhs_type.array.empty())
	{
		// Could use a loop here to support specialization constants, but it gets rather complicated with nested array types,
		// and this is a rather obscure opcode anyways, keep it simple unless we are forced to.
		uint32_t array_size = to_array_size_literal(lhs_type);
		chain.push_back(0);

		for (uint32_t i = 0; i < array_size; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.parent_type, rhs_id, rhs_type.parent_type, chain);
		}
	}
	else if (lhs_type.basetype == SPIRType::Struct)
	{
		chain.push_back(0);
		uint32_t member_count = uint32_t(lhs_type.member_types.size());
		for (uint32_t i = 0; i < member_count; i++)
		{
			chain.back() = i;
			emit_copy_logical_type(lhs_id, lhs_type.member_types[i], rhs_id, rhs_type.member_types[i], chain);
		}
	}
	else
	{
		// Need to handle unpack/packing fixups since this can differ wildly between the logical types,
		// particularly in MSL.
		// To deal with this, we emit access chains and go through emit_store_statement
		// to deal with all the special cases we can encounter.

		AccessChainMeta lhs_meta, rhs_meta;
		auto lhs = access_chain_internal(lhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &lhs_meta);
		auto rhs = access_chain_internal(rhs_id, chain.data(), uint32_t(chain.size()),
		                                 ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &rhs_meta);

		uint32_t id = ir.increase_bound_by(2);
		lhs_id = id;
		rhs_id = id + 1;

		{
			auto &lhs_expr = set<SPIRExpression>(lhs_id, std::move(lhs), lhs_type_id, true);
			lhs_expr.need_transpose = lhs_meta.need_transpose;

			if (lhs_meta.storage_is_packed)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (lhs_meta.storage_physical_type != 0)
				set_extended_decoration(lhs_id, SPIRVCrossDecorationPhysicalTypeID, lhs_meta.storage_physical_type);

			forwarded_temporaries.insert(lhs_id);
			suppressed_usage_tracking.insert(lhs_id);
		}

		{
			auto &rhs_expr = set<SPIRExpression>(rhs_id, std::move(rhs), rhs_type_id, true);
			rhs_expr.need_transpose = rhs_meta.need_transpose;

			if (rhs_meta.storage_is_packed)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypePacked);
			if (rhs_meta.storage_physical_type != 0)
				set_extended_decoration(rhs_id, SPIRVCrossDecorationPhysicalTypeID, rhs_meta.storage_physical_type);

			forwarded_temporaries.insert(rhs_id);
			suppressed_usage_tracking.insert(rhs_id);
		}

		emit_store_statement(lhs_id, rhs_id);
	}
}